

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Struct.cpp
# Opt level: O1

void __thiscall
soul::Structure::updateMemberType(Structure *this,string_view memberName,Type *newType)

{
  size_t sVar1;
  
  sVar1 = getMemberIndex(this,memberName);
  if (sVar1 < (this->members).numActive) {
    Type::operator=(&(this->members).items[sVar1].type,newType);
    return;
  }
  throwInternalCompilerError("index < numActive","operator[]",0x9e);
}

Assistant:

void Structure::updateMemberType (std::string_view memberName, const Type& newType)
{
    auto index = getMemberIndex (memberName);
    members[index].type = newType;
}